

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nearest_neighbor.cc
# Opt level: O0

void __thiscall
features::NearestNeighbor<short>::find(NearestNeighbor<short> *this,short *query,Result *result)

{
  int *piVar1;
  int local_38 [4];
  int local_28 [2];
  Result *local_20;
  Result *result_local;
  short *query_local;
  NearestNeighbor<short> *this_local;
  
  result->dist_1st_best = 0;
  result->dist_2nd_best = 0;
  result->index_1st_best = 0;
  result->index_2nd_best = 0;
  local_20 = result;
  result_local = (Result *)query;
  query_local = (short *)this;
  anon_unknown_1::short_inner_prod<short>
            (query,result,*(short **)(this + 8),*(int *)(this + 4),*(int *)this);
  local_28[1] = 0x3f01;
  local_28[0] = 0;
  local_38[3] = (int)local_20->dist_1st_best;
  piVar1 = std::max<int>(local_28,local_38 + 3);
  piVar1 = std::min<int>(local_28 + 1,piVar1);
  local_20->dist_1st_best = (short)*piVar1;
  local_38[2] = 0x3f01;
  local_38[1] = 0;
  local_38[0] = (int)local_20->dist_2nd_best;
  piVar1 = std::max<int>(local_38 + 1,local_38);
  piVar1 = std::min<int>(local_38 + 2,piVar1);
  local_20->dist_2nd_best = (short)*piVar1;
  local_20->dist_1st_best = local_20->dist_1st_best * -2 + 0x7e02;
  local_20->dist_2nd_best = local_20->dist_2nd_best * -2 + 0x7e02;
  return;
}

Assistant:

void
NearestNeighbor<short>::find (short const* query,
    NearestNeighbor<short>::Result* result) const
{
    /* Result distances are shamelessly misused to store inner products. */
    result->dist_1st_best = 0;
    result->dist_2nd_best = 0;
    result->index_1st_best = 0;
    result->index_2nd_best = 0;

    short_inner_prod<short>(query, result, this->elements,
        this->num_elements, this->dimensions);

    /*
     * Compute actual square distances.
     * The distance with 'signed char' vectors is: 2 * 127^2 - 2 * <Q, Ci>.
     * The maximum distance is (2*127)^2, which unfortunately does not fit
     * in a signed short. Therefore, the distance is clapmed at 127^2.
     */
    result->dist_1st_best = std::min(16129, std::max(0, (int)result->dist_1st_best));
    result->dist_2nd_best = std::min(16129, std::max(0, (int)result->dist_2nd_best));
    result->dist_1st_best = 32258 - 2 * result->dist_1st_best;
    result->dist_2nd_best = 32258 - 2 * result->dist_2nd_best;
}